

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void trompeloeil::reporter<trompeloeil::specialized>::sendOk
               (char *trompeloeil_mock_calls_done_correctly)

{
  long in_RDI;
  StringRef macroName;
  StringRef capturedExpression;
  AssertionHandler catchAssertionHandler;
  undefined1 local_a0 [8];
  ITransientExpression local_98;
  undefined1 *local_88;
  char *local_80;
  undefined8 local_78;
  undefined4 local_70;
  AssertionHandler local_68;
  
  local_98._vptr_ITransientExpression = (_func_int **)0x442b32;
  local_98.m_isBinaryExpression = true;
  local_98.m_result = false;
  local_98._10_6_ = 0;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 0x2a;
  capturedExpression.m_start = "trompeloeil_mock_calls_done_correctly != 0";
  Catch::AssertionHandler::AssertionHandler
            (&local_68,macroName,(SourceLineInfo *)&local_98,capturedExpression,Normal);
  local_98.m_result = in_RDI != 0;
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_004f04c8;
  local_80 = "!=";
  local_78 = 2;
  local_70 = 0;
  local_88 = local_a0;
  Catch::AssertionHandler::handleExpr(&local_68,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::AssertionHandler::complete(&local_68);
  if (local_68.m_completed == false) {
    (*(local_68.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

inline void reporter<specialized>::sendOk(
    const char* trompeloeil_mock_calls_done_correctly)
  {      
#ifdef CATCH_CONFIG_PREFIX_ALL
      CATCH_REQUIRE(trompeloeil_mock_calls_done_correctly != 0);
#else
      REQUIRE(trompeloeil_mock_calls_done_correctly != 0);
#endif
  }